

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::short_filename_formatter<spdlog::details::scoped_padder>::format
          (short_filename_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  char *buf_ptr;
  char *__s_00;
  ptrdiff_t _Num;
  scoped_padder p;
  scoped_padder sStack_48;
  
  if ((msg->source).line != 0) {
    __s = (msg->source).filename;
    pcVar1 = strrchr(__s,0x2f);
    __s_00 = pcVar1 + 1;
    if (pcVar1 == (char *)0x0) {
      __s_00 = __s;
    }
    if ((this->super_flag_formatter).padinfo_.enabled_ == true) {
      sVar2 = strlen(__s_00);
    }
    else {
      sVar2 = 0;
    }
    scoped_padder::scoped_padder(&sStack_48,sVar2,&(this->super_flag_formatter).padinfo_,dest);
    sVar2 = strlen(__s_00);
    if (__s_00 != (char *)0x0) {
      uVar3 = (dest->super_buffer<char>).size_ + sVar2;
      if ((dest->super_buffer<char>).capacity_ < uVar3) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar3);
      }
      if (sVar2 != 0) {
        memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__s_00,sVar2);
      }
      (dest->super_buffer<char>).size_ = uVar3;
    }
    scoped_padder::~scoped_padder(&sStack_48);
  }
  return;
}

Assistant:

explicit B_formatter(padding_info padinfo)
        : flag_formatter(padinfo)
    {}